

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O3

uint64 CityHash64(char *s,size_t len)

{
  uint64 uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  
  if (len < 0x21) {
    if (len < 0x11) {
      uVar1 = HashLen0to16(s,len);
      return uVar1;
    }
    lVar3 = len * 2 + -0x651e95c4d06fbfb1;
    uVar6 = *(long *)(s + (len - 8)) * lVar3;
    uVar7 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
    uVar2 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
    uVar2 = (uVar2 << 0x2e | uVar2 >> 0x12) + *(long *)s * -0x4b6d499041670d8d + uVar6;
    uVar7 = ((uVar6 << 0x22 | uVar6 >> 0x1e) + (uVar7 * 0x200000 | uVar7 >> 0x2b) +
             *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1 ^ uVar2) * lVar3;
    uVar7 = (uVar7 >> 0x2f ^ uVar2 ^ uVar7) * lVar3;
    uVar1 = (uVar7 >> 0x2f ^ uVar7) * lVar3;
  }
  else if (len < 0x41) {
    lVar3 = len * 2 + -0x651e95c4d06fbfb1;
    lVar11 = *(long *)(s + (len - 0x18));
    uVar7 = *(ulong *)(s + 8);
    lVar14 = *(long *)(s + 0x18) * 9;
    uVar6 = *(long *)s * -0x651e95c4d06fbfb1 + *(long *)(s + (len - 8));
    uVar2 = *(long *)(s + 0x10) * -0x651e95c4d06fbfb1 + lVar14;
    uVar8 = uVar6 ^ *(ulong *)(s + (len - 0x20));
    uVar6 = (uVar8 + lVar14 + 1 +
            ((uVar7 << 0x22 | uVar7 >> 0x1e) + lVar11) * 9 + (uVar6 * 0x200000 | uVar6 >> 0x2b)) *
            lVar3;
    lVar5 = (uVar2 * 0x400000 | uVar2 >> 0x2a) + lVar11;
    uVar6 = (*(long *)(s + (len - 0x10)) * lVar3 + lVar14 + uVar8 + 1 +
            (uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
             (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
             (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38)) * lVar3;
    uVar6 = (*(long *)(s + (len - 8)) + uVar2 + lVar11 + lVar5 +
            (uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
             (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
             (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38)) * lVar3;
    uVar7 = *(long *)(s + (len - 0x10)) * lVar3 + *(ulong *)(s + (len - 0x20)) +
            (uVar2 + lVar11 + uVar7 +
            (uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
             (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
             (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38)) * lVar3;
    uVar1 = (uVar7 >> 0x2f ^ uVar7) * lVar3 + lVar5;
  }
  else {
    lVar3 = *(long *)(s + (len - 0x28));
    uVar7 = *(long *)(s + (len - 0x10)) + *(long *)(s + (len - 0x38));
    uVar2 = *(ulong *)(s + (len - 0x18));
    uVar6 = (*(long *)(s + (len - 0x30)) + len ^ uVar2) * -0x622015f714c7d297;
    uVar6 = (uVar6 >> 0x2f ^ uVar2 ^ uVar6) * -0x622015f714c7d297;
    uVar6 = (uVar6 >> 0x2f ^ uVar6) * -0x622015f714c7d297;
    lVar11 = *(long *)(s + (len - 0x40)) + len;
    uVar8 = lVar3 + lVar11 + uVar6;
    uVar13 = *(long *)(s + (len - 0x38)) + *(long *)(s + (len - 0x30)) + lVar11;
    uVar8 = (uVar13 * 0x100000 | uVar13 >> 0x2c) + lVar11 + (uVar8 << 0x2b | uVar8 >> 0x15);
    lVar11 = *(long *)(s + (len - 0x20)) + uVar7 + -0x4b6d499041670d8d;
    uVar9 = uVar2 + *(long *)(s + (len - 0x10)) + lVar11;
    uVar10 = uVar9 + *(long *)(s + (len - 8));
    uVar2 = lVar3 + *(long *)(s + (len - 8)) + lVar11;
    uVar13 = uVar13 + lVar3;
    lVar3 = lVar3 * -0x4b6d499041670d8d + *(long *)s;
    uVar2 = (uVar9 * 0x100000 | uVar9 >> 0x2c) + lVar11 + (uVar2 << 0x2b | uVar2 >> 0x15);
    uVar9 = 0;
    do {
      uVar4 = lVar3 + uVar13 + uVar7 + *(long *)(s + uVar9 + 8);
      uVar7 = uVar7 + uVar8 + *(long *)(s + uVar9 + 0x30);
      uVar4 = (uVar4 * 0x8000000 | uVar4 >> 0x25) * -0x4b6d499041670d8d ^ uVar2;
      uVar7 = uVar13 + *(long *)(s + uVar9 + 0x28) +
              (uVar7 * 0x400000 | uVar7 >> 0x2a) * -0x4b6d499041670d8d;
      lVar3 = ((uVar6 + uVar10) * 0x80000000 | uVar6 + uVar10 >> 0x21) * -0x4b6d499041670d8d;
      lVar11 = uVar8 * -0x4b6d499041670d8d + *(long *)(s + uVar9);
      uVar6 = *(long *)(s + uVar9 + 8) + *(long *)(s + uVar9 + 0x10) + lVar11;
      uVar13 = uVar6 + *(long *)(s + uVar9 + 0x18);
      lVar14 = uVar2 + lVar3 + *(long *)(s + uVar9 + 0x20);
      uVar12 = *(long *)(s + uVar9 + 0x10) + uVar7 + lVar14 + *(long *)(s + uVar9 + 0x38);
      uVar2 = uVar10 + lVar11 + *(long *)(s + uVar9 + 0x18) + uVar4;
      uVar8 = lVar11 + (uVar6 * 0x100000 | uVar6 >> 0x2c) + (uVar2 << 0x2b | uVar2 >> 0x15);
      uVar2 = *(long *)(s + uVar9 + 0x28) + *(long *)(s + uVar9 + 0x30) + lVar14;
      uVar10 = uVar2 + *(long *)(s + uVar9 + 0x38);
      uVar2 = lVar14 + (uVar2 * 0x100000 | uVar2 >> 0x2c) + (uVar12 << 0x2b | uVar12 >> 0x15);
      uVar9 = uVar9 + 0x40;
      uVar6 = uVar4;
    } while ((len - 1 & 0xffffffffffffffc0) != uVar9);
    uVar6 = (uVar13 ^ uVar10) * -0x622015f714c7d297;
    uVar9 = (uVar6 >> 0x2f ^ uVar10 ^ uVar6) * -0x622015f714c7d297;
    uVar6 = (uVar8 ^ uVar2) * -0x622015f714c7d297;
    uVar2 = (uVar6 >> 0x2f ^ uVar2 ^ uVar6) * -0x622015f714c7d297;
    uVar2 = (uVar2 >> 0x2f ^ uVar2) * -0x622015f714c7d297 + lVar3;
    uVar7 = ((uVar7 >> 0x2f ^ uVar7) * -0x4b6d499041670d8d + uVar4 +
             (uVar9 >> 0x2f ^ uVar9) * -0x622015f714c7d297 ^ uVar2) * -0x622015f714c7d297;
    uVar7 = (uVar7 >> 0x2f ^ uVar2 ^ uVar7) * -0x622015f714c7d297;
    uVar1 = (uVar7 >> 0x2f ^ uVar7) * -0x622015f714c7d297;
  }
  return uVar1;
}

Assistant:

uint64 CityHash64(const char *s, size_t len) {
  if (len <= 32) {
    if (len <= 16) {
      return HashLen0to16(s, len);
    } else {
      return HashLen17to32(s, len);
    }
  } else if (len <= 64) {
    return HashLen33to64(s, len);
  }

  // For strings over 64 bytes we hash the end first, and then as we
  // loop we keep 56 bytes of state: v, w, x, y, and z.
  uint64 x = Fetch64(s + len - 40);
  uint64 y = Fetch64(s + len - 16) + Fetch64(s + len - 56);
  uint64 z = HashLen16(Fetch64(s + len - 48) + len, Fetch64(s + len - 24));
  pair<uint64, uint64> v = WeakHashLen32WithSeeds(s + len - 64, len, z);
  pair<uint64, uint64> w = WeakHashLen32WithSeeds(s + len - 32, y + k1, x);
  x = x * k1 + Fetch64(s);

  // Decrease len to the nearest multiple of 64, and operate on 64-byte chunks.
  len = (len - 1) & ~static_cast<size_t>(63);
  do {
    x = Rotate(x + y + v.first + Fetch64(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch64(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch64(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch64(s + 16));
    std::swap(z, x);
    s += 64;
    len -= 64;
  } while (len != 0);
  return HashLen16(HashLen16(v.first, w.first) + ShiftMix(y) * k1 + z,
                   HashLen16(v.second, w.second) + x);
}